

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

char * getalias(char *name)

{
  ident *this;
  char *local_20;
  ident *i;
  char *name_local;
  
  i = (ident *)name;
  this = hashset<ident>::access<char_const*>(&idents,(char **)&i);
  if (((this == (ident *)0x0) || (this->type != 4)) ||
     ((this->index < 0x19 && ((aliasstack->usedargs & 1 << ((byte)this->index & 0x1f)) == 0)))) {
    local_20 = "";
  }
  else {
    local_20 = ident::getstr(this);
  }
  return local_20;
}

Assistant:

const char *getalias(const char *name)
{
    ident *i = idents.access(name);
    return i && i->type==ID_ALIAS && (i->index >= MAXARGS || aliasstack->usedargs&(1<<i->index)) ? i->getstr() : "";
}